

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O0

void __thiscall PianoWidget::paintEvent(PianoWidget *this,QPaintEvent *event)

{
  bool bVar1;
  int iVar2;
  Pixmaps id;
  QColor local_c0;
  QRect local_b0;
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  undefined1 local_70 [40];
  undefined1 local_48 [32];
  QPainter painter;
  ulong uStack_24;
  int keyInOctave;
  KeyPaintInfo keyInfo;
  int octaveOffset;
  QPaintEvent *event_local;
  PianoWidget *this_local;
  
  keyInfo.isBlack = false;
  keyInfo._1_3_ = 0;
  unique0x10000352 = event;
  memset(&stack0xffffffffffffffdc,0,8);
  if ((this->mIsKeyDown & 1U) != 0) {
    _painter = this->mNote % 0xc;
    keyInfo._0_4_ = (this->mNote / 0xc) * 0x54;
    uStack_24 = *(ulong *)(PianoWidgetTU::KEY_INFO + (long)_painter * 8);
  }
  QPainter::QPainter((QPainter *)(local_48 + 0x18),(QPaintDevice *)&this->field_0x10);
  id = (Pixmaps)this;
  getPixmap((PianoWidget *)local_48,id);
  QPainter::drawPixmap((QPainter *)(local_48 + 0x18),0,0,(QPixmap *)local_48);
  QPixmap::~QPixmap((QPixmap *)local_48);
  if (((this->mIsKeyDown & 1U) != 0) && ((uStack_24 & 1) == 0)) {
    iVar2 = keyInfo._0_4_ + keyInOctave;
    getPixmap((PianoWidget *)local_70,id);
    QPainter::drawPixmap((QPainter *)(local_48 + 0x18),iVar2,0,(QPixmap *)local_70);
    QPixmap::~QPixmap((QPixmap *)local_70);
  }
  getPixmap((PianoWidget *)local_88,id);
  QPainter::drawPixmap((QPainter *)(local_48 + 0x18),0,0,(QPixmap *)local_88);
  QPixmap::~QPixmap((QPixmap *)local_88);
  if (((this->mIsKeyDown & 1U) != 0) && ((uStack_24 & 1) != 0)) {
    iVar2 = keyInfo._0_4_ + keyInOctave;
    getPixmap((PianoWidget *)local_a0,id);
    QPainter::drawPixmap((QPainter *)(local_48 + 0x18),iVar2,0,(QPixmap *)local_a0);
    QPixmap::~QPixmap((QPixmap *)local_a0);
  }
  bVar1 = QWidget::isEnabled(&this->super_QWidget);
  if (!bVar1) {
    QPainter::setCompositionMode((int)local_48 + RasterOp_SourceOrDestination);
    local_b0 = QWidget::rect(&this->super_QWidget);
    QColor::QColor(&local_c0,0x80,0x80,0x80,0xff);
    QPainter::fillRect((QRect *)(local_48 + 0x18),(QColor *)&local_b0);
  }
  QPainter::~QPainter((QPainter *)(local_48 + 0x18));
  return;
}

Assistant:

void PianoWidget::paintEvent(QPaintEvent *event) {
    (void)event;

    int octaveOffset = 0;
    TU::KeyPaintInfo keyInfo{ false, 0 };

    if (mIsKeyDown) {
        octaveOffset = mNote / 12;
        int keyInOctave = mNote % 12;
        octaveOffset *= TU::N_WHITEKEYS * TU::WKEY_WIDTH;

        keyInfo = TU::KEY_INFO[keyInOctave];
    }

    QPainter painter(this);
    painter.drawPixmap(0, 0, getPixmap(PixWhiteKeys));
    
    if (mIsKeyDown && !keyInfo.isBlack) {
        painter.drawPixmap(octaveOffset + keyInfo.xoffset, 0, getPixmap(PixWhiteKeyDown));
    }

    painter.drawPixmap(0, 0, getPixmap(PixBlackKeys));

    if (mIsKeyDown && keyInfo.isBlack) {
        painter.drawPixmap(octaveOffset + keyInfo.xoffset, 0, getPixmap(PixBlackKeyDown));
    }

    if (!isEnabled()) {
        painter.setCompositionMode(QPainter::CompositionMode_Plus);
        painter.fillRect(rect(), QColor(128, 128, 128));
    }

}